

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.h
# Opt level: O1

int __thiscall absl::lts_20240722::flags_internal::Flag<int>::Get(Flag<int> *this)

{
  long lVar1;
  
  absl::lts_20240722::flags_internal::FlagImpl::AssertValidType(this,(_func_type_info_ptr *)"");
  lVar1 = (this->value_).super_FlagOneWordValue.value.super___atomic_base<long>._M_i;
  if (lVar1 == 0) {
    lVar1 = absl::lts_20240722::flags_internal::FlagImpl::ReadOneWord();
  }
  return (int)lVar1;
}

Assistant:

T Get() const {
    // See implementation notes in CommandLineFlag::Get().
    union U {
      T value;
      U() {}
      ~U() { value.~T(); }
    };
    U u;

#if !defined(NDEBUG)
    impl_.AssertValidType(base_internal::FastTypeId<T>(), &GenRuntimeTypeId<T>);
#endif

    if (ABSL_PREDICT_FALSE(!value_.Get(impl_.seq_lock_, u.value))) {
      impl_.Read(&u.value);
    }
    return std::move(u.value);
  }